

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

int __thiscall
chrono::ChSystemDescriptor::BuildFbVector(ChSystemDescriptor *this,ChVectorDynamic<> *Fvector)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  pointer ppCVar4;
  ChVariables *pCVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int iVar14;
  uint uVar15;
  Index size;
  ulong uVar16;
  Index index;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ActualDstType actualDst;
  ChVectorRef local_48;
  
  iVar14 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar14;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar14);
  lVar21 = (Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  if (lVar21 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar21 != 0) {
    memset((Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data,0,lVar21 << 3);
  }
  lVar21 = (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar21 != 0) {
    lVar21 = lVar21 >> 3;
    lVar22 = 0;
    do {
      ppCVar4 = (this->vvariables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppCVar4[lVar22]->disabled == false) {
        ChVariables::Get_fb(&local_48,ppCVar4[lVar22]);
        pCVar5 = (this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar22];
        uVar3 = pCVar5->offset;
        uVar15 = (*pCVar5->_vptr_ChVariables[2])();
        pdVar6 = (Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        if ((int)uVar15 < 0 && pdVar6 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                       );
        }
        uVar16 = (ulong)(int)uVar15;
        if (((int)(uVar15 | uVar3) < 0) ||
           ((long)((Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows - uVar16) < (long)(int)uVar3)) {
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        if (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ != uVar16) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                       );
        }
        pdVar6 = pdVar6 + (int)uVar3;
        uVar17 = uVar16;
        if ((((ulong)pdVar6 & 7) == 0) &&
           (uVar17 = (ulong)(-((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7),
           (long)uVar16 <= (long)uVar17)) {
          uVar17 = uVar16;
        }
        uVar19 = uVar16 - uVar17;
        uVar18 = uVar19 + 7;
        if (-1 < (long)uVar19) {
          uVar18 = uVar19;
        }
        if (0 < (long)uVar17) {
          uVar20 = 0;
          do {
            pdVar6[uVar20] =
                 *(double *)
                  (local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + uVar20 * 8);
            uVar20 = uVar20 + 1;
          } while (uVar17 != uVar20);
        }
        uVar18 = (uVar18 & 0xfffffffffffffff8) + uVar17;
        if (7 < (long)uVar19) {
          do {
            pdVar1 = (double *)
                     (local_48.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ + uVar17 * 8);
            dVar7 = pdVar1[1];
            dVar8 = pdVar1[2];
            dVar9 = pdVar1[3];
            dVar10 = pdVar1[4];
            dVar11 = pdVar1[5];
            dVar12 = pdVar1[6];
            dVar13 = pdVar1[7];
            pdVar2 = pdVar6 + uVar17;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar7;
            pdVar2[2] = dVar8;
            pdVar2[3] = dVar9;
            pdVar2[4] = dVar10;
            pdVar2[5] = dVar11;
            pdVar2[6] = dVar12;
            pdVar2[7] = dVar13;
            uVar17 = uVar17 + 8;
          } while ((long)uVar17 < (long)uVar18);
        }
        if ((long)uVar18 < (long)uVar16) {
          do {
            pdVar6[uVar18] =
                 *(double *)
                  (local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + uVar18 * 8);
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != lVar21 + (ulong)(lVar21 == 0));
  }
  return this->n_q;
}

Assistant:

int ChSystemDescriptor::BuildFbVector(ChVectorDynamic<>& Fvector) {
    n_q = CountActiveVariables();
    Fvector.setZero(n_q);

    auto vv_size = vvariables.size();

    // Fills the 'f' vector
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            Fvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_fb();
        }
    }
    return n_q;
}